

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O3

CURLcode Curl_pp_flushsend(Curl_easy *data,pingpong *pp)

{
  CURLcode CVar1;
  long in_RAX;
  size_t sVar2;
  curltime cVar3;
  ssize_t written;
  long local_18;
  
  local_18 = in_RAX;
  CVar1 = Curl_nwrite(data,0,pp->sendthis + (pp->sendsize - pp->sendleft),pp->sendleft,&local_18);
  if (CVar1 == CURLE_OK) {
    sVar2 = pp->sendleft - local_18;
    if (sVar2 == 0) {
      pp->sendthis = (char *)0x0;
      pp->sendleft = 0;
      pp->sendsize = 0;
      cVar3 = Curl_now();
      (pp->response).tv_sec = cVar3.tv_sec;
      (pp->response).tv_usec = cVar3.tv_usec;
    }
    else {
      pp->sendleft = sVar2;
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_pp_flushsend(struct Curl_easy *data,
                           struct pingpong *pp)
{
  /* we have a piece of a command still left to send */
  ssize_t written;
  CURLcode result = Curl_nwrite(data, FIRSTSOCKET,
                                pp->sendthis + pp->sendsize - pp->sendleft,
                                pp->sendleft, &written);
  if(result)
    return result;

  if(written != (ssize_t)pp->sendleft) {
    /* only a fraction was sent */
    pp->sendleft -= written;
  }
  else {
    pp->sendthis = NULL;
    pp->sendleft = pp->sendsize = 0;
    pp->response = Curl_now();
  }
  return CURLE_OK;
}